

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CTypeID lj_ctype_getname(CTState *cts,CType **ctp,GCstr *name,uint32_t tmask)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  CType *pCVar4;
  
  uVar2 = (uint)name + 0xfb3ee249;
  uVar3 = (uVar2 ^ (uint)name) - (uVar2 * 0x4000 | uVar2 >> 0x12);
  uVar1 = cts->hash[(uVar2 >> 0xd ^ uVar3) - (uVar3 >> 0x13) & 0x7f];
  while (uVar1 != 0) {
    uVar2 = (uint)uVar1;
    pCVar4 = cts->tab + uVar1;
    if (((GCstr *)(pCVar4->name).gcptr64 == name) && ((tmask >> (pCVar4->info >> 0x1c) & 1) != 0))
    goto LAB_0011b94a;
    uVar1 = pCVar4->next;
  }
  uVar2 = 0;
  pCVar4 = cts->tab;
LAB_0011b94a:
  *ctp = pCVar4;
  return uVar2;
}

Assistant:

CTypeID lj_ctype_getname(CTState *cts, CType **ctp, GCstr *name, uint32_t tmask)
{
  CTypeID id = cts->hash[ct_hashname(name)];
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (gcref(ct->name) == obj2gco(name) &&
	((tmask >> ctype_type(ct->info)) & 1)) {
      *ctp = ct;
      return id;
    }
    id = ct->next;
  }
  *ctp = &cts->tab[0];  /* Simplify caller logic. ctype_get() would assert. */
  return 0;
}